

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retnode.cpp
# Opt level: O2

void __thiscall RetNode::print(RetNode *this)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  poVar1 = std::operator<<(poVar1,";");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  poVar1 = std::operator<<(poVar1,"[label=\"Ret\"];");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::operator<<(poVar1,"--");
  (*((this->toReturn)._M_t.super___uniq_ptr_impl<ASTNode,_std::default_delete<ASTNode>_>._M_t.
     super__Tuple_impl<0UL,_ASTNode_*,_std::default_delete<ASTNode>_>.
     super__Head_base<0UL,_ASTNode_*,_false>._M_head_impl)->_vptr_ASTNode[4])();
  return;
}

Assistant:

void RetNode::print() {
    std::cout << currentNode << ";" << std::endl;
    std::cout << currentNode << "[label=\"Ret\"];" << std::endl;
    std::cout << currentNode << "--"; toReturn->print();
}